

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes3.cc
# Opt level: O0

void __thiscall Node::OutputBlock(Node *this,ostream *os)

{
  undefined8 uVar1;
  ostream *poVar2;
  undefined1 local_90 [40];
  Node *Program;
  undefined1 local_38 [40];
  ostream *os_local;
  Node *this_local;
  
  local_38._32_8_ = os;
  os_local = (ostream *)this;
  if (this == (Node *)0x0) {
    Indent_abi_cxx11_((Node *)local_38);
    poVar2 = std::operator<<(os,(string *)local_38);
    poVar2 = std::operator<<(poVar2,";");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)local_38);
  }
  else {
    Indent_abi_cxx11_((Node *)&Program);
    poVar2 = std::operator<<(os,(string *)&Program);
    poVar2 = std::operator<<(poVar2,"{");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&Program);
    Level = Level + 1;
    for (local_90._32_8_ = this; uVar1 = local_38._32_8_, (Node *)local_90._32_8_ != (Node *)0x0;
        local_90._32_8_ = *(Node **)(local_90._32_8_ + 0x50)) {
      if ((*(int *)(local_90._32_8_ + 0x68) == 0) || (CompileFlag != 0)) {
        OutputCodeOne((Node *)local_90._32_8_,(ostream *)local_38._32_8_);
      }
    }
    Level = Level + -1;
    Indent_abi_cxx11_((Node *)local_90);
    poVar2 = std::operator<<((ostream *)uVar1,(string *)local_90);
    poVar2 = std::operator<<(poVar2,"}");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)local_90);
  }
  return;
}

Assistant:

void Node::OutputBlock(
	std::ostream& os	/**< iostream to write C++ code to */
)
{
	//
	// If this is a 0 bit of code, just output a semicolon
	//
	if (this == 0)
	{
		os << Indent() << ";" << std::endl;
	}
	else
	{
		//
		// Start the block
		//
		os << Indent() << "{" << std::endl;

		Level++;

		//
		// Local Variables
		//
		Node *Program = this;

		//
		// Starting at the top node, we scan down handling each
		// level 0 node type as necessary.
		//
		// Could do this by calling OutputCode recursively for the Down
		// level instead of splitting into OutputCode and OutputCodeOne,
		// but that would probibly consume too much stack space.
		//
		while (Program != 0)
		{
			//
			// Handle Statement
			//
			if ((Program->FromInclude == 0) || (CompileFlag != 0))
			{
				Program->OutputCodeOne(os);
			}

			//
			// Get next node
			//
			Program = Program->Block[0];
		}

		//
		// End the block
		//
		Level--;
		os << Indent() << "}" << std::endl;
	}
}